

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeMemClearExternAndSetNull(Mem *p)

{
  long *plVar1;
  long *in_RDI;
  VdbeFrame *pFrame;
  FuncDef *in_stack_00000058;
  Mem *in_stack_00000060;
  RowSet *in_stack_fffffffffffffff0;
  
  if ((*(ushort *)(in_RDI + 1) & 0x2000) != 0) {
    sqlite3VdbeMemFinalize(in_stack_00000060,in_stack_00000058);
  }
  if ((*(ushort *)(in_RDI + 1) & 0x400) == 0) {
    if ((*(ushort *)(in_RDI + 1) & 0x20) == 0) {
      if ((*(ushort *)(in_RDI + 1) & 0x40) != 0) {
        plVar1 = (long *)*in_RDI;
        plVar1[1] = *(long *)(*plVar1 + 0xf8);
        *(long **)(*plVar1 + 0xf8) = plVar1;
      }
    }
    else {
      sqlite3RowSetClear(in_stack_fffffffffffffff0);
    }
  }
  else {
    (*(code *)in_RDI[6])(in_RDI[2]);
  }
  *(undefined2 *)(in_RDI + 1) = 1;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClearExternAndSetNull(Mem *p){
  assert( p->db==0 || sqlite3_mutex_held(p->db->mutex) );
  assert( VdbeMemDynamic(p) );
  if( p->flags&MEM_Agg ){
    sqlite3VdbeMemFinalize(p, p->u.pDef);
    assert( (p->flags & MEM_Agg)==0 );
    testcase( p->flags & MEM_Dyn );
  }
  if( p->flags&MEM_Dyn ){
    assert( (p->flags&MEM_RowSet)==0 );
    assert( p->xDel!=SQLITE_DYNAMIC && p->xDel!=0 );
    p->xDel((void *)p->z);
  }else if( p->flags&MEM_RowSet ){
    sqlite3RowSetClear(p->u.pRowSet);
  }else if( p->flags&MEM_Frame ){
    VdbeFrame *pFrame = p->u.pFrame;
    pFrame->pParent = pFrame->v->pDelFrame;
    pFrame->v->pDelFrame = pFrame;
  }
  p->flags = MEM_Null;
}